

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O2

void __thiscall JUnitTestOutput::printCurrentTestStarted(JUnitTestOutput *this,UtestShell *test)

{
  JUnitTestOutputImpl *pJVar1;
  int iVar2;
  size_t sVar3;
  JUnitTestCaseResultNode *pJVar4;
  
  (this->impl_->results_).testCount_ = (this->impl_->results_).testCount_ + 1;
  UtestShell::getGroup((UtestShell *)&stack0xffffffffffffffd8);
  SimpleString::operator=(&(this->impl_->results_).group_,(SimpleString *)&stack0xffffffffffffffd8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffd8);
  sVar3 = (*GetPlatformSpecificTimeInMillis)();
  pJVar1 = this->impl_;
  (pJVar1->results_).startTime_ = sVar3;
  if ((pJVar1->results_).tail_ == (JUnitTestCaseResultNode *)0x0) {
    pJVar4 = (JUnitTestCaseResultNode *)
             operator_new(0x50,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/JUnitTestOutput.cpp"
                          ,0x88);
    JUnitTestCaseResultNode::JUnitTestCaseResultNode(pJVar4);
    pJVar1 = this->impl_;
    (pJVar1->results_).tail_ = pJVar4;
    (pJVar1->results_).head_ = pJVar4;
  }
  else {
    pJVar4 = (JUnitTestCaseResultNode *)
             operator_new(0x50,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/JUnitTestOutput.cpp"
                          ,0x8b);
    JUnitTestCaseResultNode::JUnitTestCaseResultNode(pJVar4);
    pJVar1 = this->impl_;
    ((pJVar1->results_).tail_)->next_ = pJVar4;
    (pJVar1->results_).tail_ = pJVar4;
  }
  UtestShell::getName((UtestShell *)&stack0xffffffffffffffd8);
  SimpleString::operator=
            (&((this->impl_->results_).tail_)->name_,(SimpleString *)&stack0xffffffffffffffd8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffd8);
  UtestShell::getFile((UtestShell *)&stack0xffffffffffffffd8);
  SimpleString::operator=
            (&((this->impl_->results_).tail_)->file_,(SimpleString *)&stack0xffffffffffffffd8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffd8);
  sVar3 = UtestShell::getLineNumber(test);
  ((this->impl_->results_).tail_)->lineNumber_ = sVar3;
  iVar2 = (*test->_vptr_UtestShell[6])(test);
  if ((char)iVar2 == '\0') {
    ((this->impl_->results_).tail_)->ignored_ = true;
  }
  return;
}

Assistant:

void JUnitTestOutput::printCurrentTestStarted(const UtestShell& test)
{
    impl_->results_.testCount_++;
    impl_->results_.group_ = test.getGroup();
    impl_->results_.startTime_ = (size_t) GetPlatformSpecificTimeInMillis();

    if (impl_->results_.tail_ == NULLPTR) {
        impl_->results_.head_ = impl_->results_.tail_
                = new JUnitTestCaseResultNode;
    }
    else {
        impl_->results_.tail_->next_ = new JUnitTestCaseResultNode;
        impl_->results_.tail_ = impl_->results_.tail_->next_;
    }
    impl_->results_.tail_->name_ = test.getName();
    impl_->results_.tail_->file_ = test.getFile();
    impl_->results_.tail_->lineNumber_ = test.getLineNumber();
    if (!test.willRun()) {
        impl_->results_.tail_->ignored_ = true;
    }
}